

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.c
# Opt level: O0

float orient3dslow(float *pa,float *pb,float *pc,float *pd)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int elen;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float _2;
  float _1;
  float _0;
  float _n;
  float _m;
  float _l;
  float _k;
  float _j;
  float _i;
  float err3;
  float err2;
  float err1;
  float blo;
  float bhi;
  float a1lo;
  float a1hi;
  float a0lo;
  float a0hi;
  float abig;
  float c;
  float around;
  float bround;
  float avirt;
  float bvirt;
  int deterlen;
  float deter [192];
  float local_7b8;
  int ablen;
  float abdet [128];
  int clen;
  int blen;
  int alen;
  float cdet [64];
  float bdet [64];
  float adet [64];
  int temp32tlen;
  int temp32len;
  int temp16len;
  float temp32t [32];
  float temp32 [32];
  float temp16 [16];
  float cxay [8];
  float cxby [8];
  float bxay [8];
  float axcy [8];
  float bxcy [8];
  float axby [8];
  float cxay7;
  float cxby7;
  float bxay7;
  float axcy7;
  float bxcy7;
  float axby7;
  float negatetail;
  float negate;
  float cdztail;
  float cdytail;
  float cdxtail;
  float bdztail;
  float bdytail;
  float bdxtail;
  float adztail;
  float adytail;
  float adxtail;
  float cdz;
  float cdy;
  float cdx;
  float bdz;
  float bdy;
  float bdx;
  float adz;
  float ady;
  float adx;
  float *pd_local;
  float *pc_local;
  float *pb_local;
  float *pa_local;
  
  fVar13 = *pa - *pd;
  fVar14 = (*pa - (fVar13 + (*pa - fVar13))) + ((*pa - fVar13) - *pd);
  fVar15 = pa[1] - pd[1];
  fVar16 = (pa[1] - (fVar15 + (pa[1] - fVar15))) + ((pa[1] - fVar15) - pd[1]);
  fVar17 = pa[2] - pd[2];
  fVar1 = pa[2];
  fVar2 = pd[2];
  fVar3 = pa[2];
  fVar18 = *pb - *pd;
  fVar19 = (*pb - (fVar18 + (*pb - fVar18))) + ((*pb - fVar18) - *pd);
  fVar20 = pb[1] - pd[1];
  fVar21 = (pb[1] - (fVar20 + (pb[1] - fVar20))) + ((pb[1] - fVar20) - pd[1]);
  fVar22 = pb[2] - pd[2];
  fVar4 = pb[2];
  fVar5 = pd[2];
  fVar6 = pb[2];
  fVar23 = *pc - *pd;
  fVar24 = (*pc - (fVar23 + (*pc - fVar23))) + ((*pc - fVar23) - *pd);
  fVar25 = pc[1] - pd[1];
  fVar26 = (pc[1] - (fVar25 + (pc[1] - fVar25))) + ((pc[1] - fVar25) - pd[1]);
  fVar27 = pc[2] - pd[2];
  fVar7 = pc[2];
  fVar8 = pd[2];
  fVar9 = pc[2];
  fVar28 = splitter * fVar14 - (splitter * fVar14 - fVar14);
  fVar29 = fVar14 - fVar28;
  fVar30 = splitter * fVar21 - (splitter * fVar21 - fVar21);
  fVar31 = fVar21 - fVar30;
  fVar32 = fVar14 * fVar21;
  bxcy[6] = fVar29 * fVar31 + -(-fVar28 * fVar31 + -fVar29 * fVar30 + -fVar28 * fVar30 + fVar32);
  fVar33 = splitter * fVar13 - (splitter * fVar13 - fVar13);
  fVar30 = (fVar13 - fVar33) * fVar31 +
           -(-fVar33 * fVar31 + -(fVar13 - fVar33) * fVar30 + -fVar33 * fVar30 + fVar13 * fVar21);
  fVar31 = fVar32 + fVar30;
  fVar33 = fVar31 - fVar32;
  fVar30 = (fVar32 - (fVar31 - fVar33)) + (fVar30 - fVar33);
  fVar31 = splitter * fVar20 - (splitter * fVar20 - fVar20);
  fVar28 = fVar29 * (fVar20 - fVar31) +
           -(-fVar28 * (fVar20 - fVar31) + -fVar29 * fVar31 + -fVar28 * fVar31 + fVar14 * fVar20);
  fVar29 = fVar30 + fVar28;
  fVar31 = fVar29 - fVar30;
  bxcy[7] = (fVar30 - (fVar29 - fVar31)) + (fVar28 - fVar31);
  fVar28 = -fVar15;
  fVar29 = -fVar16;
  fVar30 = splitter * fVar19 - (splitter * fVar19 - fVar19);
  fVar31 = fVar19 - fVar30;
  fVar32 = splitter * fVar29 - (splitter * fVar29 - fVar29);
  fVar33 = fVar29 - fVar32;
  fVar34 = fVar19 * fVar29;
  cxby[6] = fVar31 * fVar33 + -(-fVar30 * fVar33 + -fVar31 * fVar32 + -fVar30 * fVar32 + fVar34);
  fVar35 = splitter * fVar18 - (splitter * fVar18 - fVar18);
  fVar36 = fVar18 - fVar35;
  fVar29 = fVar18 * fVar29;
  fVar32 = fVar36 * fVar33 + -(-fVar35 * fVar33 + -fVar36 * fVar32 + -fVar35 * fVar32 + fVar29);
  fVar37 = fVar34 + fVar32;
  fVar32 = (fVar34 - (fVar37 - (fVar37 - fVar34))) + (fVar32 - (fVar37 - fVar34));
  fVar33 = fVar29 + fVar37;
  fVar37 = fVar37 - (fVar33 - fVar29);
  fVar29 = splitter * fVar28 - (splitter * fVar28 - fVar28);
  fVar34 = fVar28 - fVar29;
  fVar38 = fVar19 * fVar28;
  fVar30 = fVar31 * fVar34 + -(-fVar30 * fVar34 + -fVar31 * fVar29 + -fVar30 * fVar29 + fVar38);
  fVar31 = fVar32 + fVar30;
  cxby[7] = (fVar32 - (fVar31 - (fVar31 - fVar32))) + (fVar30 - (fVar31 - fVar32));
  fVar30 = fVar37 + fVar31;
  fVar31 = (fVar37 - (fVar30 - (fVar30 - fVar37))) + (fVar31 - (fVar30 - fVar37));
  fVar32 = fVar33 + fVar30;
  fVar30 = (fVar33 - (fVar32 - (fVar32 - fVar33))) + (fVar30 - (fVar32 - fVar33));
  fVar28 = fVar18 * fVar28;
  fVar29 = fVar36 * fVar34 + -(-fVar35 * fVar34 + -fVar36 * fVar29 + -fVar35 * fVar29 + fVar28);
  fVar33 = fVar38 + fVar29;
  fVar29 = (fVar38 - (fVar33 - (fVar33 - fVar38))) + (fVar29 - (fVar33 - fVar38));
  fVar34 = fVar31 + fVar29;
  bxay[0] = (fVar31 - (fVar34 - (fVar34 - fVar31))) + (fVar29 - (fVar34 - fVar31));
  fVar29 = fVar30 + fVar34;
  fVar30 = (fVar30 - (fVar29 - (fVar29 - fVar30))) + (fVar34 - (fVar29 - fVar30));
  fVar31 = fVar32 + fVar29;
  fVar29 = (fVar32 - (fVar31 - (fVar31 - fVar32))) + (fVar29 - (fVar31 - fVar32));
  fVar32 = fVar28 + fVar33;
  fVar28 = (fVar28 - (fVar32 - (fVar32 - fVar28))) + (fVar33 - (fVar32 - fVar28));
  fVar33 = fVar30 + fVar28;
  bxay[1] = (fVar30 - (fVar33 - (fVar33 - fVar30))) + (fVar28 - (fVar33 - fVar30));
  fVar28 = fVar29 + fVar33;
  fVar29 = (fVar29 - (fVar28 - (fVar28 - fVar29))) + (fVar33 - (fVar28 - fVar29));
  fVar30 = fVar31 + fVar28;
  fVar28 = (fVar31 - (fVar30 - (fVar30 - fVar31))) + (fVar28 - (fVar30 - fVar31));
  fVar31 = fVar29 + fVar32;
  bxay[2] = (fVar29 - (fVar31 - (fVar31 - fVar29))) + (fVar32 - (fVar31 - fVar29));
  fVar29 = fVar28 + fVar31;
  bxay[3] = (fVar28 - (fVar29 - (fVar29 - fVar28))) + (fVar31 - (fVar29 - fVar28));
  bxay[5] = fVar30 + fVar29;
  bxay[4] = (fVar30 - (bxay[5] - (bxay[5] - fVar30))) + (fVar29 - (bxay[5] - fVar30));
  fVar28 = splitter * fVar19 - (splitter * fVar19 - fVar19);
  fVar29 = fVar19 - fVar28;
  fVar30 = splitter * fVar26 - (splitter * fVar26 - fVar26);
  fVar31 = fVar26 - fVar30;
  fVar32 = fVar19 * fVar26;
  axcy[6] = fVar29 * fVar31 + -(-fVar28 * fVar31 + -fVar29 * fVar30 + -fVar28 * fVar30 + fVar32);
  fVar33 = splitter * fVar18 - (splitter * fVar18 - fVar18);
  fVar34 = fVar18 - fVar33;
  fVar35 = fVar18 * fVar26;
  fVar30 = fVar34 * fVar31 + -(-fVar33 * fVar31 + -fVar34 * fVar30 + -fVar33 * fVar30 + fVar35);
  fVar36 = fVar32 + fVar30;
  fVar30 = (fVar32 - (fVar36 - (fVar36 - fVar32))) + (fVar30 - (fVar36 - fVar32));
  fVar31 = fVar35 + fVar36;
  fVar36 = fVar36 - (fVar31 - fVar35);
  fVar32 = splitter * fVar25 - (splitter * fVar25 - fVar25);
  fVar35 = fVar25 - fVar32;
  fVar19 = fVar19 * fVar25;
  fVar28 = fVar29 * fVar35 + -(-fVar28 * fVar35 + -fVar29 * fVar32 + -fVar28 * fVar32 + fVar19);
  fVar29 = fVar30 + fVar28;
  axcy[7] = (fVar30 - (fVar29 - (fVar29 - fVar30))) + (fVar28 - (fVar29 - fVar30));
  fVar28 = fVar36 + fVar29;
  fVar29 = (fVar36 - (fVar28 - (fVar28 - fVar36))) + (fVar29 - (fVar28 - fVar36));
  fVar30 = fVar31 + fVar28;
  fVar28 = (fVar31 - (fVar30 - (fVar30 - fVar31))) + (fVar28 - (fVar30 - fVar31));
  fVar18 = fVar18 * fVar25;
  fVar31 = fVar34 * fVar35 + -(-fVar33 * fVar35 + -fVar34 * fVar32 + -fVar33 * fVar32 + fVar18);
  fVar32 = fVar19 + fVar31;
  fVar31 = (fVar19 - (fVar32 - (fVar32 - fVar19))) + (fVar31 - (fVar32 - fVar19));
  fVar33 = fVar29 + fVar31;
  bxcy[0] = (fVar29 - (fVar33 - (fVar33 - fVar29))) + (fVar31 - (fVar33 - fVar29));
  fVar29 = fVar28 + fVar33;
  fVar28 = (fVar28 - (fVar29 - (fVar29 - fVar28))) + (fVar33 - (fVar29 - fVar28));
  fVar31 = fVar30 + fVar29;
  fVar29 = (fVar30 - (fVar31 - (fVar31 - fVar30))) + (fVar29 - (fVar31 - fVar30));
  fVar30 = fVar18 + fVar32;
  fVar32 = (fVar18 - (fVar30 - (fVar30 - fVar18))) + (fVar32 - (fVar30 - fVar18));
  fVar33 = fVar28 + fVar32;
  bxcy[1] = (fVar28 - (fVar33 - (fVar33 - fVar28))) + (fVar32 - (fVar33 - fVar28));
  fVar28 = fVar29 + fVar33;
  fVar29 = (fVar29 - (fVar28 - (fVar28 - fVar29))) + (fVar33 - (fVar28 - fVar29));
  fVar32 = fVar31 + fVar28;
  fVar28 = (fVar31 - (fVar32 - (fVar32 - fVar31))) + (fVar28 - (fVar32 - fVar31));
  fVar31 = fVar29 + fVar30;
  bxcy[2] = (fVar29 - (fVar31 - (fVar31 - fVar29))) + (fVar30 - (fVar31 - fVar29));
  fVar29 = fVar28 + fVar31;
  bxcy[3] = (fVar28 - (fVar29 - (fVar29 - fVar28))) + (fVar31 - (fVar29 - fVar28));
  bxcy[5] = fVar32 + fVar29;
  bxcy[4] = (fVar32 - (bxcy[5] - (bxcy[5] - fVar32))) + (fVar29 - (bxcy[5] - fVar32));
  fVar20 = -fVar20;
  fVar21 = -fVar21;
  fVar28 = splitter * fVar24 - (splitter * fVar24 - fVar24);
  fVar29 = fVar24 - fVar28;
  fVar30 = splitter * fVar21 - (splitter * fVar21 - fVar21);
  fVar31 = fVar21 - fVar30;
  fVar32 = fVar24 * fVar21;
  cxay[6] = fVar29 * fVar31 + -(-fVar28 * fVar31 + -fVar29 * fVar30 + -fVar28 * fVar30 + fVar32);
  fVar33 = splitter * fVar23 - (splitter * fVar23 - fVar23);
  fVar34 = fVar23 - fVar33;
  fVar21 = fVar23 * fVar21;
  fVar30 = fVar34 * fVar31 + -(-fVar33 * fVar31 + -fVar34 * fVar30 + -fVar33 * fVar30 + fVar21);
  fVar35 = fVar32 + fVar30;
  fVar30 = (fVar32 - (fVar35 - (fVar35 - fVar32))) + (fVar30 - (fVar35 - fVar32));
  fVar31 = fVar21 + fVar35;
  fVar35 = fVar35 - (fVar31 - fVar21);
  fVar21 = splitter * fVar20 - (splitter * fVar20 - fVar20);
  fVar32 = fVar20 - fVar21;
  fVar36 = fVar24 * fVar20;
  fVar28 = fVar29 * fVar32 + -(-fVar28 * fVar32 + -fVar29 * fVar21 + -fVar28 * fVar21 + fVar36);
  fVar29 = fVar30 + fVar28;
  cxay[7] = (fVar30 - (fVar29 - (fVar29 - fVar30))) + (fVar28 - (fVar29 - fVar30));
  fVar28 = fVar35 + fVar29;
  fVar29 = (fVar35 - (fVar28 - (fVar28 - fVar35))) + (fVar29 - (fVar28 - fVar35));
  fVar30 = fVar31 + fVar28;
  fVar28 = (fVar31 - (fVar30 - (fVar30 - fVar31))) + (fVar28 - (fVar30 - fVar31));
  fVar20 = fVar23 * fVar20;
  fVar21 = fVar34 * fVar32 + -(-fVar33 * fVar32 + -fVar34 * fVar21 + -fVar33 * fVar21 + fVar20);
  fVar31 = fVar36 + fVar21;
  fVar21 = (fVar36 - (fVar31 - (fVar31 - fVar36))) + (fVar21 - (fVar31 - fVar36));
  fVar32 = fVar29 + fVar21;
  cxby[0] = (fVar29 - (fVar32 - (fVar32 - fVar29))) + (fVar21 - (fVar32 - fVar29));
  fVar29 = fVar28 + fVar32;
  fVar28 = (fVar28 - (fVar29 - (fVar29 - fVar28))) + (fVar32 - (fVar29 - fVar28));
  fVar21 = fVar30 + fVar29;
  fVar29 = (fVar30 - (fVar21 - (fVar21 - fVar30))) + (fVar29 - (fVar21 - fVar30));
  fVar30 = fVar20 + fVar31;
  fVar20 = (fVar20 - (fVar30 - (fVar30 - fVar20))) + (fVar31 - (fVar30 - fVar20));
  fVar31 = fVar28 + fVar20;
  cxby[1] = (fVar28 - (fVar31 - (fVar31 - fVar28))) + (fVar20 - (fVar31 - fVar28));
  fVar28 = fVar29 + fVar31;
  fVar29 = (fVar29 - (fVar28 - (fVar28 - fVar29))) + (fVar31 - (fVar28 - fVar29));
  fVar20 = fVar21 + fVar28;
  fVar28 = (fVar21 - (fVar20 - (fVar20 - fVar21))) + (fVar28 - (fVar20 - fVar21));
  fVar21 = fVar29 + fVar30;
  cxby[2] = (fVar29 - (fVar21 - (fVar21 - fVar29))) + (fVar30 - (fVar21 - fVar29));
  fVar29 = fVar28 + fVar21;
  cxby[3] = (fVar28 - (fVar29 - (fVar29 - fVar28))) + (fVar21 - (fVar29 - fVar28));
  cxby[5] = fVar20 + fVar29;
  cxby[4] = (fVar20 - (cxby[5] - (cxby[5] - fVar20))) + (fVar29 - (cxby[5] - fVar20));
  fVar28 = splitter * fVar24 - (splitter * fVar24 - fVar24);
  fVar29 = fVar24 - fVar28;
  fVar20 = splitter * fVar16 - (splitter * fVar16 - fVar16);
  fVar21 = fVar16 - fVar20;
  fVar30 = fVar24 * fVar16;
  temp16[0xe] = fVar29 * fVar21 + -(-fVar28 * fVar21 + -fVar29 * fVar20 + -fVar28 * fVar20 + fVar30)
  ;
  fVar31 = splitter * fVar23 - (splitter * fVar23 - fVar23);
  fVar32 = fVar23 - fVar31;
  fVar16 = fVar23 * fVar16;
  fVar20 = fVar32 * fVar21 + -(-fVar31 * fVar21 + -fVar32 * fVar20 + -fVar31 * fVar20 + fVar16);
  fVar33 = fVar30 + fVar20;
  fVar20 = (fVar30 - (fVar33 - (fVar33 - fVar30))) + (fVar20 - (fVar33 - fVar30));
  fVar21 = fVar16 + fVar33;
  fVar33 = fVar33 - (fVar21 - fVar16);
  fVar30 = splitter * fVar15 - (splitter * fVar15 - fVar15);
  fVar34 = fVar15 - fVar30;
  fVar24 = fVar24 * fVar15;
  fVar28 = fVar29 * fVar34 + -(-fVar28 * fVar34 + -fVar29 * fVar30 + -fVar28 * fVar30 + fVar24);
  fVar29 = fVar20 + fVar28;
  temp16[0xf] = (fVar20 - (fVar29 - (fVar29 - fVar20))) + (fVar28 - (fVar29 - fVar20));
  fVar28 = fVar33 + fVar29;
  fVar29 = (fVar33 - (fVar28 - (fVar28 - fVar33))) + (fVar29 - (fVar28 - fVar33));
  fVar20 = fVar21 + fVar28;
  fVar28 = (fVar21 - (fVar20 - (fVar20 - fVar21))) + (fVar28 - (fVar20 - fVar21));
  fVar23 = fVar23 * fVar15;
  fVar21 = fVar32 * fVar34 + -(-fVar31 * fVar34 + -fVar32 * fVar30 + -fVar31 * fVar30 + fVar23);
  fVar15 = fVar24 + fVar21;
  fVar21 = (fVar24 - (fVar15 - (fVar15 - fVar24))) + (fVar21 - (fVar15 - fVar24));
  fVar30 = fVar29 + fVar21;
  cxay[0] = (fVar29 - (fVar30 - (fVar30 - fVar29))) + (fVar21 - (fVar30 - fVar29));
  fVar29 = fVar28 + fVar30;
  fVar28 = (fVar28 - (fVar29 - (fVar29 - fVar28))) + (fVar30 - (fVar29 - fVar28));
  fVar21 = fVar20 + fVar29;
  fVar29 = (fVar20 - (fVar21 - (fVar21 - fVar20))) + (fVar29 - (fVar21 - fVar20));
  fVar20 = fVar23 + fVar15;
  fVar15 = (fVar23 - (fVar20 - (fVar20 - fVar23))) + (fVar15 - (fVar20 - fVar23));
  fVar30 = fVar28 + fVar15;
  cxay[1] = (fVar28 - (fVar30 - (fVar30 - fVar28))) + (fVar15 - (fVar30 - fVar28));
  fVar28 = fVar29 + fVar30;
  fVar29 = (fVar29 - (fVar28 - (fVar28 - fVar29))) + (fVar30 - (fVar28 - fVar29));
  fVar15 = fVar21 + fVar28;
  fVar28 = (fVar21 - (fVar15 - (fVar15 - fVar21))) + (fVar28 - (fVar15 - fVar21));
  fVar21 = fVar29 + fVar20;
  cxay[2] = (fVar29 - (fVar21 - (fVar21 - fVar29))) + (fVar20 - (fVar21 - fVar29));
  fVar29 = fVar28 + fVar21;
  cxay[3] = (fVar28 - (fVar29 - (fVar29 - fVar28))) + (fVar21 - (fVar29 - fVar28));
  cxay[5] = fVar15 + fVar29;
  cxay[4] = (fVar15 - (cxay[5] - (cxay[5] - fVar15))) + (fVar29 - (cxay[5] - fVar15));
  fVar25 = -fVar25;
  fVar26 = -fVar26;
  fVar28 = splitter * fVar14 - (splitter * fVar14 - fVar14);
  fVar29 = fVar14 - fVar28;
  fVar20 = splitter * fVar26 - (splitter * fVar26 - fVar26);
  fVar21 = fVar26 - fVar20;
  fVar15 = fVar14 * fVar26;
  bxay[6] = fVar29 * fVar21 + -(-fVar28 * fVar21 + -fVar29 * fVar20 + -fVar28 * fVar20 + fVar15);
  fVar30 = splitter * fVar13 - (splitter * fVar13 - fVar13);
  fVar31 = fVar13 - fVar30;
  fVar26 = fVar13 * fVar26;
  fVar20 = fVar31 * fVar21 + -(-fVar30 * fVar21 + -fVar31 * fVar20 + -fVar30 * fVar20 + fVar26);
  fVar32 = fVar15 + fVar20;
  fVar20 = (fVar15 - (fVar32 - (fVar32 - fVar15))) + (fVar20 - (fVar32 - fVar15));
  fVar21 = fVar26 + fVar32;
  fVar32 = fVar32 - (fVar21 - fVar26);
  fVar26 = splitter * fVar25 - (splitter * fVar25 - fVar25);
  fVar15 = fVar25 - fVar26;
  fVar14 = fVar14 * fVar25;
  fVar28 = fVar29 * fVar15 + -(-fVar28 * fVar15 + -fVar29 * fVar26 + -fVar28 * fVar26 + fVar14);
  fVar29 = fVar20 + fVar28;
  bxay[7] = (fVar20 - (fVar29 - (fVar29 - fVar20))) + (fVar28 - (fVar29 - fVar20));
  fVar28 = fVar32 + fVar29;
  fVar29 = (fVar32 - (fVar28 - (fVar28 - fVar32))) + (fVar29 - (fVar28 - fVar32));
  fVar20 = fVar21 + fVar28;
  fVar28 = (fVar21 - (fVar20 - (fVar20 - fVar21))) + (fVar28 - (fVar20 - fVar21));
  fVar13 = fVar13 * fVar25;
  fVar21 = fVar31 * fVar15 + -(-fVar30 * fVar15 + -fVar31 * fVar26 + -fVar30 * fVar26 + fVar13);
  fVar25 = fVar14 + fVar21;
  fVar21 = (fVar14 - (fVar25 - (fVar25 - fVar14))) + (fVar21 - (fVar25 - fVar14));
  fVar26 = fVar29 + fVar21;
  axcy[0] = (fVar29 - (fVar26 - (fVar26 - fVar29))) + (fVar21 - (fVar26 - fVar29));
  fVar29 = fVar28 + fVar26;
  fVar28 = (fVar28 - (fVar29 - (fVar29 - fVar28))) + (fVar26 - (fVar29 - fVar28));
  fVar21 = fVar20 + fVar29;
  fVar29 = (fVar20 - (fVar21 - (fVar21 - fVar20))) + (fVar29 - (fVar21 - fVar20));
  fVar20 = fVar13 + fVar25;
  fVar25 = (fVar13 - (fVar20 - (fVar20 - fVar13))) + (fVar25 - (fVar20 - fVar13));
  fVar26 = fVar28 + fVar25;
  axcy[1] = (fVar28 - (fVar26 - (fVar26 - fVar28))) + (fVar25 - (fVar26 - fVar28));
  fVar28 = fVar29 + fVar26;
  fVar29 = (fVar29 - (fVar28 - (fVar28 - fVar29))) + (fVar26 - (fVar28 - fVar29));
  fVar25 = fVar21 + fVar28;
  fVar28 = (fVar21 - (fVar25 - (fVar25 - fVar21))) + (fVar28 - (fVar25 - fVar21));
  fVar21 = fVar29 + fVar20;
  axcy[2] = (fVar29 - (fVar21 - (fVar21 - fVar29))) + (fVar20 - (fVar21 - fVar29));
  fVar29 = fVar28 + fVar21;
  axcy[3] = (fVar28 - (fVar29 - (fVar29 - fVar28))) + (fVar21 - (fVar29 - fVar28));
  axcy[5] = fVar25 + fVar29;
  axcy[4] = (fVar25 - (axcy[5] - (axcy[5] - fVar25))) + (fVar29 - (axcy[5] - fVar25));
  iVar10 = fast_expansion_sum_zeroelim(8,axcy + 6,8,cxay + 6,temp32 + 0x1e);
  iVar11 = scale_expansion_zeroelim(iVar10,temp32 + 0x1e,SUB84((double)fVar17,0),temp32t + 0x1e);
  iVar10 = scale_expansion_zeroelim
                     (iVar10,temp32 + 0x1e,
                      SUB84((double)((fVar3 - (fVar17 + (fVar1 - fVar17))) +
                                    ((fVar1 - fVar17) - fVar2)),0),(float *)&temp32len);
  iVar10 = fast_expansion_sum_zeroelim(iVar11,temp32t + 0x1e,iVar10,(float *)&temp32len,bdet + 0x3e)
  ;
  iVar11 = fast_expansion_sum_zeroelim(8,temp16 + 0xe,8,bxay + 6,temp32 + 0x1e);
  iVar12 = scale_expansion_zeroelim(iVar11,temp32 + 0x1e,SUB84((double)fVar22,0),temp32t + 0x1e);
  iVar11 = scale_expansion_zeroelim
                     (iVar11,temp32 + 0x1e,
                      SUB84((double)((fVar6 - (fVar22 + (fVar4 - fVar22))) +
                                    ((fVar4 - fVar22) - fVar5)),0),(float *)&temp32len);
  iVar11 = fast_expansion_sum_zeroelim(iVar12,temp32t + 0x1e,iVar11,(float *)&temp32len,cdet + 0x3e)
  ;
  iVar12 = fast_expansion_sum_zeroelim(8,bxcy + 6,8,cxby + 6,temp32 + 0x1e);
  elen = scale_expansion_zeroelim(iVar12,temp32 + 0x1e,SUB84((double)fVar27,0),temp32t + 0x1e);
  iVar12 = scale_expansion_zeroelim
                     (iVar12,temp32 + 0x1e,
                      SUB84((double)((fVar9 - (fVar27 + (fVar7 - fVar27))) +
                                    ((fVar7 - fVar27) - fVar8)),0),(float *)&temp32len);
  abdet[0x7f] = (float)fast_expansion_sum_zeroelim
                                 (elen,temp32t + 0x1e,iVar12,(float *)&temp32len,(float *)&blen);
  iVar10 = fast_expansion_sum_zeroelim(iVar10,bdet + 0x3e,iVar11,cdet + 0x3e,&local_7b8);
  iVar10 = fast_expansion_sum_zeroelim(iVar10,&local_7b8,(int)abdet[0x7f],(float *)&blen,&bvirt);
  return (&bvirt)[iVar10 + -1];
}

Assistant:

REAL orient3dslow(pa, pb, pc, pd)
REAL *pa;
REAL *pb;
REAL *pc;
REAL *pd;
{
  INEXACT REAL adx, ady, adz, bdx, bdy, bdz, cdx, cdy, cdz;
  REAL adxtail, adytail, adztail;
  REAL bdxtail, bdytail, bdztail;
  REAL cdxtail, cdytail, cdztail;
  REAL negate, negatetail;
  INEXACT REAL axby7, bxcy7, axcy7, bxay7, cxby7, cxay7;
  REAL axby[8], bxcy[8], axcy[8], bxay[8], cxby[8], cxay[8];
  REAL temp16[16], temp32[32], temp32t[32];
  int temp16len, temp32len, temp32tlen;
  REAL adet[64], bdet[64], cdet[64];
  int alen, blen, clen;
  REAL abdet[128];
  int ablen;
  REAL deter[192];
  int deterlen;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL a0hi, a0lo, a1hi, a1lo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j, _k, _l, _m, _n;
  REAL _0, _1, _2;

  Two_Diff(pa[0], pd[0], adx, adxtail);
  Two_Diff(pa[1], pd[1], ady, adytail);
  Two_Diff(pa[2], pd[2], adz, adztail);
  Two_Diff(pb[0], pd[0], bdx, bdxtail);
  Two_Diff(pb[1], pd[1], bdy, bdytail);
  Two_Diff(pb[2], pd[2], bdz, bdztail);
  Two_Diff(pc[0], pd[0], cdx, cdxtail);
  Two_Diff(pc[1], pd[1], cdy, cdytail);
  Two_Diff(pc[2], pd[2], cdz, cdztail);

  Two_Two_Product(adx, adxtail, bdy, bdytail,
                  axby7, axby[6], axby[5], axby[4],
                  axby[3], axby[2], axby[1], axby[0]);
  axby[7] = axby7;
  negate = -ady;
  negatetail = -adytail;
  Two_Two_Product(bdx, bdxtail, negate, negatetail,
                  bxay7, bxay[6], bxay[5], bxay[4],
                  bxay[3], bxay[2], bxay[1], bxay[0]);
  bxay[7] = bxay7;
  Two_Two_Product(bdx, bdxtail, cdy, cdytail,
                  bxcy7, bxcy[6], bxcy[5], bxcy[4],
                  bxcy[3], bxcy[2], bxcy[1], bxcy[0]);
  bxcy[7] = bxcy7;
  negate = -bdy;
  negatetail = -bdytail;
  Two_Two_Product(cdx, cdxtail, negate, negatetail,
                  cxby7, cxby[6], cxby[5], cxby[4],
                  cxby[3], cxby[2], cxby[1], cxby[0]);
  cxby[7] = cxby7;
  Two_Two_Product(cdx, cdxtail, ady, adytail,
                  cxay7, cxay[6], cxay[5], cxay[4],
                  cxay[3], cxay[2], cxay[1], cxay[0]);
  cxay[7] = cxay7;
  negate = -cdy;
  negatetail = -cdytail;
  Two_Two_Product(adx, adxtail, negate, negatetail,
                  axcy7, axcy[6], axcy[5], axcy[4],
                  axcy[3], axcy[2], axcy[1], axcy[0]);
  axcy[7] = axcy7;

  temp16len = fast_expansion_sum_zeroelim(8, bxcy, 8, cxby, temp16);
  temp32len = scale_expansion_zeroelim(temp16len, temp16, adz, temp32);
  temp32tlen = scale_expansion_zeroelim(temp16len, temp16, adztail, temp32t);
  alen = fast_expansion_sum_zeroelim(temp32len, temp32, temp32tlen, temp32t,
                                     adet);

  temp16len = fast_expansion_sum_zeroelim(8, cxay, 8, axcy, temp16);
  temp32len = scale_expansion_zeroelim(temp16len, temp16, bdz, temp32);
  temp32tlen = scale_expansion_zeroelim(temp16len, temp16, bdztail, temp32t);
  blen = fast_expansion_sum_zeroelim(temp32len, temp32, temp32tlen, temp32t,
                                     bdet);

  temp16len = fast_expansion_sum_zeroelim(8, axby, 8, bxay, temp16);
  temp32len = scale_expansion_zeroelim(temp16len, temp16, cdz, temp32);
  temp32tlen = scale_expansion_zeroelim(temp16len, temp16, cdztail, temp32t);
  clen = fast_expansion_sum_zeroelim(temp32len, temp32, temp32tlen, temp32t,
                                     cdet);

  ablen = fast_expansion_sum_zeroelim(alen, adet, blen, bdet, abdet);
  deterlen = fast_expansion_sum_zeroelim(ablen, abdet, clen, cdet, deter);

  return deter[deterlen - 1];
}